

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<double,_ft::allocator<double>_>::push_back
          (list<double,_ft::allocator<double>_> *this,value_type_conflict1 *val)

{
  pointer plVar1;
  node *pnVar2;
  listNode<double> local_38;
  pointer local_20;
  node *newNode;
  value_type_conflict1 *val_local;
  list<double,_ft::allocator<double>_> *this_local;
  
  newNode = (node *)val;
  val_local = (value_type_conflict1 *)this;
  plVar1 = allocator<ft::listNode<double>_>::allocate
                     ((allocator<ft::listNode<double>_> *)&this->field_0x18,1);
  local_20 = plVar1;
  listNode<double>::listNode(&local_38,&newNode->data);
  allocator<ft::listNode<double>_>::construct
            ((allocator<ft::listNode<double>_> *)&this->field_0x18,plVar1,&local_38);
  listNode<double>::~listNode(&local_38);
  pnVar2 = tail(this);
  local_20->prev = pnVar2->prev;
  local_20->prev->next = local_20;
  pnVar2 = tail(this);
  plVar1 = local_20;
  local_20->next = pnVar2;
  pnVar2 = tail(this);
  pnVar2->prev = plVar1;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void push_back(value_type const & val) {
		node*	newNode = this->m_alloc.allocate(1);
		this->m_alloc.construct(newNode, val);
		newNode->prev = this->tail()->prev;
		newNode->prev->next = newNode;
		newNode->next = this->tail();
		this->tail()->prev = newNode;
		++this->m_size;
	}